

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::SyncRepeatedFieldWithMapNoLock(DynamicMapField *this)

{
  Arena *this_00;
  value_type *pvVar1;
  double value;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  uint32 uVar5;
  int32 iVar6;
  undefined4 extraout_var;
  FieldDescriptor *this_01;
  undefined4 extraout_var_00;
  FieldDescriptor *this_02;
  RepeatedPtrFieldBase *this_03;
  undefined4 extraout_var_01;
  LogMessage *other;
  uint64 uVar7;
  string *psVar8;
  int64 iVar9;
  Message *pMVar10;
  Message *pMVar11;
  Reflection *this_04;
  MapValueRef *this_05;
  float value_00;
  LogFinisher local_c1;
  const_iterator it;
  LogMessage local_a8;
  string local_70;
  string local_50;
  
  (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  iVar3 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  std::__cxx11::string::string((string *)&local_a8,"key",(allocator *)&it);
  this_01 = Descriptor::FindFieldByName
                      ((Descriptor *)CONCAT44(extraout_var,iVar3),(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  iVar3 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  std::__cxx11::string::string((string *)&local_a8,"value",(allocator *)&it);
  this_02 = Descriptor::FindFieldByName
                      ((Descriptor *)CONCAT44(extraout_var_00,iVar3),(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  this_03 = &((this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase;
  if (this_03 == (RepeatedPtrFieldBase *)0x0) {
    this_00 = (this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.arena_;
    if (this_00 == (Arena *)0x0) {
      this_03 = (RepeatedPtrFieldBase *)operator_new(0x18);
      ((RepeatedPtrFieldBase *)&this_03->arena_)->arena_ = (Arena *)0x0;
      this_03->current_size_ = 0;
      this_03->total_size_ = 0;
      this_03->rep_ = (Rep *)0x0;
    }
    else {
      Arena::AllocHook(this_00,(type_info *)&RepeatedPtrField<google::protobuf::Message>::typeinfo,
                       0x18);
      this_03 = (RepeatedPtrFieldBase *)
                ArenaImpl::AllocateAlignedAndAddCleanup
                          (&this_00->impl_,0x18,
                           arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                          );
      ((RepeatedPtrFieldBase *)&this_03->arena_)->arena_ = this_00;
      this_03->current_size_ = 0;
      this_03->total_size_ = 0;
      this_03->rep_ = (Rep *)0x0;
    }
    (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
    super_MapFieldBase.repeated_field_ = (RepeatedPtrField<google::protobuf::Message> *)this_03;
  }
  RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(this_03);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin(&it,&this->map_);
  while (it.it_.node_ != (Node *)0x0) {
    iVar3 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[3])();
    pMVar11 = (Message *)CONCAT44(extraout_var_01,iVar3);
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
              (&((this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase,pMVar11);
    pvVar1 = ((it.it_.node_)->kv).v_;
    CVar4 = FieldDescriptor::cpp_type(this_01);
    switch(CVar4) {
    case CPPTYPE_INT32:
      iVar6 = MapKey::GetInt32Value(&pvVar1->first);
      Reflection::SetInt32(this_04,pMVar11,this_01,iVar6);
      break;
    case CPPTYPE_INT64:
      iVar9 = MapKey::GetInt64Value(&pvVar1->first);
      Reflection::SetInt64(this_04,pMVar11,this_01,iVar9);
      break;
    case CPPTYPE_UINT32:
      uVar5 = MapKey::GetUInt32Value(&pvVar1->first);
      Reflection::SetUInt32(this_04,pMVar11,this_01,uVar5);
      break;
    case CPPTYPE_UINT64:
      uVar7 = MapKey::GetUInt64Value(&pvVar1->first);
      Reflection::SetUInt64(this_04,pMVar11,this_01,uVar7);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                (&local_a8,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.cc"
                 ,0x192);
      other = LogMessage::operator<<(&local_a8,"Can\'t get here.");
      LogFinisher::operator=(&local_c1,other);
      LogMessage::~LogMessage(&local_a8);
      break;
    case CPPTYPE_BOOL:
      bVar2 = MapKey::GetBoolValue(&pvVar1->first);
      Reflection::SetBool(this_04,pMVar11,this_01,bVar2);
      break;
    case CPPTYPE_STRING:
      psVar8 = MapKey::GetStringValue_abi_cxx11_(&pvVar1->first);
      std::__cxx11::string::string((string *)&local_50,(string *)psVar8);
      Reflection::SetString(this_04,pMVar11,this_01,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    pvVar1 = ((it.it_.node_)->kv).v_;
    CVar4 = FieldDescriptor::cpp_type(this_02);
    if (CVar4 - CPPTYPE_INT32 < 10) {
      this_05 = &pvVar1->second;
      switch(CVar4) {
      case CPPTYPE_INT32:
        iVar6 = MapValueRef::GetInt32Value(this_05);
        Reflection::SetInt32(this_04,pMVar11,this_02,iVar6);
        break;
      case CPPTYPE_INT64:
        iVar9 = MapValueRef::GetInt64Value(this_05);
        Reflection::SetInt64(this_04,pMVar11,this_02,iVar9);
        break;
      case CPPTYPE_UINT32:
        uVar5 = MapValueRef::GetUInt32Value(this_05);
        Reflection::SetUInt32(this_04,pMVar11,this_02,uVar5);
        break;
      case CPPTYPE_UINT64:
        uVar7 = MapValueRef::GetUInt64Value(this_05);
        Reflection::SetUInt64(this_04,pMVar11,this_02,uVar7);
        break;
      case CPPTYPE_DOUBLE:
        value = MapValueRef::GetDoubleValue(this_05);
        Reflection::SetDouble(this_04,pMVar11,this_02,value);
        break;
      case CPPTYPE_FLOAT:
        value_00 = MapValueRef::GetFloatValue(this_05);
        Reflection::SetFloat(this_04,pMVar11,this_02,value_00);
        break;
      case CPPTYPE_BOOL:
        bVar2 = MapValueRef::GetBoolValue(this_05);
        Reflection::SetBool(this_04,pMVar11,this_02,bVar2);
        break;
      case CPPTYPE_ENUM:
        iVar3 = MapValueRef::GetEnumValue(this_05);
        Reflection::SetEnumValue(this_04,pMVar11,this_02,iVar3);
        break;
      case CPPTYPE_STRING:
        psVar8 = MapValueRef::GetStringValue_abi_cxx11_(this_05);
        std::__cxx11::string::string((string *)&local_70,(string *)psVar8);
        Reflection::SetString(this_04,pMVar11,this_02,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        break;
      case CPPTYPE_MESSAGE:
        pMVar10 = MapValueRef::GetMessageValue(this_05);
        pMVar11 = Reflection::MutableMessage(this_04,pMVar11,this_02,(MessageFactory *)0x0);
        (*(pMVar11->super_MessageLite)._vptr_MessageLite[0x10])(pMVar11,pMVar10);
      }
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::operator++(&it.it_);
  }
  return;
}

Assistant:

void DynamicMapField::SyncRepeatedFieldWithMapNoLock() const {
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des =
      default_entry_->GetDescriptor()->FindFieldByName("key");
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  if (MapFieldBase::repeated_field_ == NULL) {
    if (MapFieldBase::arena_ == NULL) {
      MapFieldBase::repeated_field_ = new RepeatedPtrField<Message>();
    } else {
      MapFieldBase::repeated_field_ =
          Arena::CreateMessage<RepeatedPtrField<Message> >(
              MapFieldBase::arena_);
    }
  }

  MapFieldBase::repeated_field_->Clear();

  for (Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
       it != map_.end(); ++it) {
    Message* new_entry = default_entry_->New();
    MapFieldBase::repeated_field_->AddAllocated(new_entry);
    const MapKey& map_key = it->first;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, key_des, map_key.GetStringValue());
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, key_des, map_key.GetInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, key_des, map_key.GetInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, key_des, map_key.GetUInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, key_des, map_key.GetUInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, key_des, map_key.GetBoolValue());
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }
    const MapValueRef& map_val = it->second;
    switch (val_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, val_des, map_val.GetStringValue());
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, val_des, map_val.GetInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, val_des, map_val.GetInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, val_des, map_val.GetUInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, val_des, map_val.GetUInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, val_des, map_val.GetBoolValue());
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
        reflection->SetDouble(new_entry, val_des, map_val.GetDoubleValue());
        break;
      case FieldDescriptor::CPPTYPE_FLOAT:
        reflection->SetFloat(new_entry, val_des, map_val.GetFloatValue());
        break;
      case FieldDescriptor::CPPTYPE_ENUM:
        reflection->SetEnumValue(new_entry, val_des, map_val.GetEnumValue());
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = map_val.GetMessageValue();
        reflection->MutableMessage(new_entry, val_des)->CopyFrom(message);
        break;
      }
    }
  }
}